

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

int Abc_NtkBddToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  uint uVar1;
  uint uVar2;
  DdManager *unique;
  long *plVar3;
  int *pGuide;
  DdNode *bFuncOn;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  uint *__ptr;
  void *pvVar8;
  DdNode **pFuncs;
  Mem_Flex_t *pMan;
  Vec_Str_t *vCube;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  uint uVar12;
  size_t __size;
  char *__file;
  char *__assertion;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint *local_58;
  int nCubes;
  long local_38;
  
  unique = (DdManager *)pNtk->pManFunc;
  pVVar10 = pNtk->vObjs;
  uVar1 = pVVar10->nSize;
  lVar13 = (long)(int)uVar1;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar12 = uVar1;
  }
  __ptr[1] = 0;
  local_38 = lVar13;
  if (uVar12 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    if ((int)uVar1 < 1) goto LAB_0084ebca;
    __size = (ulong)uVar1 * 4;
LAB_0084eab1:
    pvVar8 = malloc(__size);
LAB_0084eab9:
    local_58 = __ptr + 2;
    *(void **)local_58 = pvVar8;
    if (pvVar8 == (void *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    *__ptr = uVar1;
  }
  else {
    pvVar8 = malloc((long)(int)uVar12 << 2);
    *(void **)(__ptr + 2) = pvVar8;
    if ((int)uVar12 < (int)uVar1) {
      __size = local_38 * 4;
      if (pvVar8 == (void *)0x0) goto LAB_0084eab1;
      pvVar8 = realloc(pvVar8,__size);
      goto LAB_0084eab9;
    }
  }
  auVar4 = _DAT_0093d220;
  if (0 < (int)uVar1) {
    lVar13 = (ulong)uVar1 - 1;
    auVar14._8_4_ = (int)lVar13;
    auVar14._0_8_ = lVar13;
    auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar14 = auVar14 ^ _DAT_0093d220;
    auVar15 = _DAT_0093e4e0;
    auVar16 = _DAT_0093d210;
    do {
      auVar17 = auVar16 ^ auVar4;
      iVar6 = auVar14._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar6 && auVar14._0_4_ < auVar17._0_4_ || iVar6 < auVar17._4_4_)
                & 1)) {
        *(int *)((long)pvVar8 + lVar13) = fMode;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        *(int *)((long)pvVar8 + lVar13 + 4) = fMode;
      }
      auVar17 = auVar15 ^ auVar4;
      iVar5 = auVar17._4_4_;
      if (iVar5 <= iVar6 && (iVar5 != iVar6 || auVar17._0_4_ <= auVar14._0_4_)) {
        *(int *)((long)pvVar8 + lVar13 + 8) = fMode;
        *(int *)((long)pvVar8 + lVar13 + 0xc) = fMode;
      }
      lVar11 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar11 + 4;
      lVar11 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar11 + 4;
      lVar13 = lVar13 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar13);
  }
LAB_0084ebca:
  local_58 = __ptr + 2;
  if (nCubeLimit < 1000000000) {
    iVar6 = pVVar10->nSize;
    iVar5 = 8;
    if (6 < iVar6 - 1U) {
      iVar5 = iVar6;
    }
    if (iVar5 == 0) {
      pFuncs = (DdNode **)0x0;
    }
    else {
      pFuncs = (DdNode **)malloc((long)iVar5 << 3);
    }
    memset(pFuncs,0,(long)iVar6 * 8);
    iVar5 = Cudd_ReorderingStatus(unique,(Cudd_ReorderingType *)&nCubes);
    if (iVar5 != 0) {
      __assert_fail("!Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x178,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
    }
    pVVar10 = pNtk->vObjs;
    lVar13 = (long)pVVar10->nSize;
    if (0 < lVar13) {
      lVar11 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar11];
        if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
           ((*(int *)(*plVar3 + 4) != 4 ||
            ((*(int *)((long)plVar3 + 0x1c) != 1 || (plVar3[7] != 0)))))) {
          if (iVar6 <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          pFuncs[lVar11] = (DdNode *)plVar3[7];
        }
        lVar11 = lVar11 + 1;
      } while (lVar13 != lVar11);
    }
    pGuide = *(int **)local_58;
    iVar6 = Extra_bddCountCubes(unique,pFuncs,iVar6,fMode,nCubeLimit,pGuide);
    nCubes = iVar6;
    if (pFuncs != (DdNode **)0x0) {
      free(pFuncs);
    }
    if (iVar6 == -1) {
      if (pGuide != (int *)0x0) {
        free(pGuide);
      }
      free(__ptr);
      return 0;
    }
  }
  if (pNtk->ntkFunc != ABC_FUNC_BDD) {
    __assert_fail("Abc_NtkHasBdd(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x187,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
  }
  if (0 < unique->size) {
    Cudd_zddVarsFromBddVars(unique,2);
  }
  pMan = Mem_FlexStart();
  vCube = (Vec_Str_t *)malloc(0x10);
  vCube->nCap = 100;
  vCube->nSize = 0;
  pcVar9 = (char *)malloc(100);
  vCube->pArray = pcVar9;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar13];
      if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
         ((*(int *)(*plVar3 + 4) != 4 || ((*(int *)((long)plVar3 + 0x1c) != 1 || (plVar3[7] != 0))))
         )) {
        bFuncOn = (DdNode *)plVar3[7];
        if (bFuncOn == (DdNode *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                        ,0x193,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
        }
        if (local_38 <= lVar13) {
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
          ;
          pcVar9 = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_0084eff1:
          __assert_fail(__assertion,__file,0x1a9,pcVar9);
        }
        pvVar8 = *(void **)local_58;
        pcVar9 = Abc_ConvertBddToSop(pMan,unique,bFuncOn,bFuncOn,*(int *)((long)plVar3 + 0x1c),0,
                                     vCube,*(int *)((long)pvVar8 + lVar13 * 4));
        plVar3[1] = (long)pcVar9;
        if (pcVar9 == (char *)0x0) {
          Mem_FlexStop(pMan,0);
          Abc_NtkCleanNext(pNtk);
          free(pvVar8);
          free(__ptr);
          if (vCube->pArray != (char *)0x0) {
            free(vCube->pArray);
          }
          free(vCube);
          return 0;
        }
        iVar6 = Abc_SopGetVarNum(pcVar9);
        if (iVar6 == 0) {
          *(undefined4 *)((long)plVar3 + 0x1c) = 0;
          iVar6 = 0;
        }
        else {
          iVar6 = *(int *)((long)plVar3 + 0x1c);
        }
        iVar5 = Abc_SopGetVarNum((char *)plVar3[1]);
        if (iVar6 != iVar5) {
          uVar1 = *(uint *)(plVar3 + 2);
          uVar12 = *(uint *)((long)plVar3 + 0x14);
          uVar2 = *(uint *)((long)plVar3 + 0x1c);
          uVar7 = Abc_SopGetVarNum((char *)plVar3[1]);
          printf("Node %d with level %d has %d fanins but its SOP has support size %d.\n",
                 (ulong)uVar1,(ulong)(uVar12 >> 0xc),(ulong)uVar2,(ulong)uVar7);
          fflush(_stdout);
        }
        iVar6 = *(int *)((long)plVar3 + 0x1c);
        iVar5 = Abc_SopGetVarNum((char *)plVar3[1]);
        if (iVar6 != iVar5) {
          __assertion = "Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext)";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
          ;
          pcVar9 = "int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)";
          goto LAB_0084eff1;
        }
        pVVar10 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  if (*(void **)local_58 != (void *)0x0) {
    free(*(void **)local_58);
  }
  free(__ptr);
  if (vCube->pArray != (char *)0x0) {
    free(vCube->pArray);
  }
  free(vCube);
  pNtk->ntkFunc = ABC_FUNC_SOP;
  pNtk->pManFunc = pMan;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      plVar3 = (long *)pVVar10->pArray[lVar13];
      if (((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
         ((*(int *)(*plVar3 + 4) != 4 || ((*(int *)((long)plVar3 + 0x1c) != 1 || (plVar3[7] != 0))))
         )) {
        Cudd_RecursiveDeref(unique,(DdNode *)plVar3[7]);
        plVar3[7] = plVar3[1];
        plVar3[1] = 0;
        pVVar10 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  Extra_StopManager(unique);
  Abc_NtkSortSops(pNtk);
  return 1;
}

Assistant:

int Abc_NtkBddToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    Vec_Int_t * vGuide;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    Mem_Flex_t * pManNew;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    DdNode * bFunc;
    int i, nCubes;

    // compute SOP size
    vGuide = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vGuide, Abc_NtkObjNumMax(pNtk), fMode );
    if ( nCubeLimit < ABC_INFINITY )
    {
        // collect all BDDs into one array
        Vec_Ptr_t * vFuncs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
        assert( !Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes) );
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_ObjIsBarBuf(pNode) )
                Vec_PtrWriteEntry( vFuncs, i, pNode->pData );
        // compute the number of cubes in the ISOPs and detemine polarity
        nCubes = Extra_bddCountCubes( dd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs), fMode, nCubeLimit, Vec_IntArray(vGuide) );
        Vec_PtrFree( vFuncs );
        if ( nCubes == -1 )
        {
            Vec_IntFree( vGuide );
            return 0;
        }
        //printf( "The total number of cubes = %d.\n", nCubes );
    }

    assert( Abc_NtkHasBdd(pNtk) );
    if ( dd->size > 0 )
    Cudd_zddVarsFromBddVars( dd, 2 );
    // create the new manager
    pManNew = Mem_FlexStart();

    // go through the objects
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;
        pNode->pNext = (Abc_Obj_t *)Abc_ConvertBddToSop( pManNew, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, Vec_IntEntry(vGuide, i) );
        if ( pNode->pNext == NULL )
        {
            Mem_FlexStop( pManNew, 0 );
            Abc_NtkCleanNext( pNtk );
//            printf( "Converting from BDDs to SOPs has failed.\n" );
            Vec_IntFree( vGuide );
            Vec_StrFree( vCube );
            return 0;
        }
        // it may happen that a constant node was created after structural mapping
        if ( Abc_SopGetVarNum((char *)pNode->pNext) == 0 )
            pNode->vFanins.nSize = 0;
        // check the support
        if ( Abc_ObjFaninNum(pNode) != Abc_SopGetVarNum((char *)pNode->pNext) )
        {
            printf( "Node %d with level %d has %d fanins but its SOP has support size %d.\n", 
                pNode->Id, pNode->Level, Abc_ObjFaninNum(pNode), Abc_SopGetVarNum((char *)pNode->pNext) );
            fflush( stdout );
        }
        assert( Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext) );
    }
    Vec_IntFree( vGuide );
    Vec_StrFree( vCube );

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_SOP;
    // set the new manager
    pNtk->pManFunc = pManNew;
    // transfer from next to data
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = pNode->pNext;
        pNode->pNext = NULL;
    }

    // check for remaining references in the package
    Extra_StopManager( dd );

    // reorder fanins and cubes to make SOPs more human-readable
    Abc_NtkSortSops( pNtk );
    return 1;
}